

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameWalkWith(Walker *pWalker,Select *pSelect)

{
  int *piVar1;
  With *pWith_00;
  long in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  Select *p;
  With *pCopy;
  int i;
  Parse *pParse;
  With *pWith;
  NameContext sNC;
  undefined8 in_stack_ffffffffffffff88;
  u8 bFree;
  Select *p_00;
  Parse *pParse_00;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar2;
  int iVar3;
  sqlite3 *db;
  sqlite3 *local_40 [7];
  long local_8;
  
  bFree = (u8)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  piVar1 = *(int **)(in_RSI + 0x68);
  if (piVar1 != (int *)0x0) {
    db = (sqlite3 *)*in_RDI;
    uVar2 = 0xaaaaaaaa;
    pParse_00 = (Parse *)0x0;
    if ((*(uint *)(*(long *)(piVar1 + 8) + 4) & 0x40) == 0) {
      pWith_00 = sqlite3WithDup(db,(With *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffff98));
      pParse_00 = (Parse *)sqlite3WithPush((Parse *)CONCAT44(uVar2,in_stack_ffffffffffffff98),
                                           pWith_00,bFree);
    }
    for (iVar3 = 0; iVar3 < *piVar1; iVar3 = iVar3 + 1) {
      p_00 = *(Select **)(piVar1 + (long)iVar3 * 0xc + 8);
      memset(local_40,0xaa,0x38);
      memset(local_40,0,0x38);
      local_40[0] = db;
      if (pParse_00 != (Parse *)0x0) {
        sqlite3SelectPrep(pParse_00,p_00,(NameContext *)0x1e3cc8);
      }
      if (*(char *)((long)&local_40[0]->pVfs->xDlClose + 7) != '\0') goto LAB_001e3d4b;
      sqlite3WalkSelect((Walker *)CONCAT44(iVar3,in_stack_ffffffffffffff98),(Select *)pParse_00);
      sqlite3RenameExprlistUnmap
                ((Parse *)CONCAT44(iVar3,in_stack_ffffffffffffff98),(ExprList *)pParse_00);
    }
    if ((pParse_00 != (Parse *)0x0) && (*(Parse **)&db->lookaside == pParse_00)) {
      *(With **)&db->lookaside = (With *)pParse_00->zErrMsg;
    }
  }
LAB_001e3d4b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void renameWalkWith(Walker *pWalker, Select *pSelect){
  With *pWith = pSelect->pWith;
  if( pWith ){
    Parse *pParse = pWalker->pParse;
    int i;
    With *pCopy = 0;
    assert( pWith->nCte>0 );
    if( (pWith->a[0].pSelect->selFlags & SF_Expanded)==0 ){
      /* Push a copy of the With object onto the with-stack. We use a copy
      ** here as the original will be expanded and resolved (flags SF_Expanded
      ** and SF_Resolved) below. And the parser code that uses the with-stack
      ** fails if the Select objects on it have already been expanded and
      ** resolved.  */
      pCopy = sqlite3WithDup(pParse->db, pWith);
      pCopy = sqlite3WithPush(pParse, pCopy, 1);
    }
    for(i=0; i<pWith->nCte; i++){
      Select *p = pWith->a[i].pSelect;
      NameContext sNC;
      memset(&sNC, 0, sizeof(sNC));
      sNC.pParse = pParse;
      if( pCopy ) sqlite3SelectPrep(sNC.pParse, p, &sNC);
      if( sNC.pParse->db->mallocFailed ) return;
      sqlite3WalkSelect(pWalker, p);
      sqlite3RenameExprlistUnmap(pParse, pWith->a[i].pCols);
    }
    if( pCopy && pParse->pWith==pCopy ){
      pParse->pWith = pCopy->pOuter;
    }
  }
}